

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

uint8_t icu_63::anon_unknown_15::leadByteForCP(UChar32 c)

{
  undefined1 local_9;
  UChar32 c_local;
  
  if (c < 0x80) {
    local_9 = (uint8_t)c;
  }
  else if (c < 0x800) {
    local_9 = (char)(c >> 6) + 0xc0;
  }
  else {
    local_9 = 0xe0;
  }
  return local_9;
}

Assistant:

inline uint8_t leadByteForCP(UChar32 c) {
    if (c <= 0x7f) {
        return (uint8_t)c;
    } else if (c <= 0x7ff) {
        return (uint8_t)(0xc0+(c>>6));
    } else {
        // Should not occur because ccc(U+0300)!=0.
        return 0xe0;
    }
}